

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PCondFlushLineSmart(TidyDocImpl *doc,uint indent)

{
  TidyPrintImpl *pprint;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  if ((doc->pprint).linelen != 0) {
    PFlushLineImpl(doc);
    if ((int)(doc->config).value[0x55].v != 2) {
      prvTidyWriteChar(10,doc->docOut);
      (doc->pprint).line = (doc->pprint).line + 1;
    }
    (doc->pprint).indent[0].spaces = indent;
  }
  return;
}

Assistant:

static void PCondFlushLineSmart( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;

    if ( pprint->linelen > 0 )
    {
         PFlushLineImpl( doc );

         /* Issue #228 - cfgBool( doc, TidyVertSpace ); */
         if(TidyAddVS) {
            TY_(WriteChar)( '\n', doc->docOut );
            pprint->line++;
         }

         pprint->indent[ 0 ].spaces = indent;
    }
}